

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDynamicLoader.cxx
# Opt level: O0

void __thiscall
cmDynamicLoaderCache::CacheFile(cmDynamicLoaderCache *this,char *path,LibraryHandle p)

{
  LibraryHandle pvVar1;
  LibraryHandle __s;
  bool bVar2;
  mapped_type *ppvVar3;
  allocator<char> local_49;
  key_type local_48;
  LibraryHandle local_28;
  LibraryHandle h;
  LibraryHandle p_local;
  char *path_local;
  cmDynamicLoaderCache *this_local;
  
  h = p;
  p_local = path;
  path_local = (char *)this;
  bVar2 = GetCacheFile(this,path,&local_28);
  if (bVar2) {
    FlushCache(this,(char *)p_local);
  }
  __s = p_local;
  pvVar1 = h;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,(char *)__s,&local_49);
  ppvVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
            ::operator[](&this->CacheMap,&local_48);
  *ppvVar3 = pvVar1;
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  return;
}

Assistant:

void cmDynamicLoaderCache::CacheFile(const char* path,
                                     cmsys::DynamicLoader::LibraryHandle p)
{
  cmsys::DynamicLoader::LibraryHandle h;
  if (this->GetCacheFile(path, h)) {
    this->FlushCache(path);
  }
  this->CacheMap[path] = p;
}